

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

void pospopcnt_u8_avx512vbmi_harley_seal(uint8_t *data,size_t len,uint32_t *flags)

{
  int i;
  long lVar1;
  uint32_t pospopcnt16 [16];
  uint32_t local_58 [16];
  
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  pospopcnt_u16_avx512vbmi_harley_seal((uint16_t *)data,(uint32_t)(len >> 1),local_58);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    flags[lVar1] = local_58[lVar1 + 8] + local_58[lVar1];
  }
  if ((len & 1) == 0) {
    return;
  }
  pospopcnt_u8_scalar_naive_single(data[len - 1],flags);
  return;
}

Assistant:

pospopcnt_u16_stub(pospopcnt_u16_avx512vbmi_harley_seal)
pospopcnt_u8_stub(pospopcnt_u8_avx512vbmi_harley_seal)
#endif

int pospopcnt_u16_avx512_masked_ops(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i counter = _mm512_setzero_si512();
    __m512i ones = _mm512_set1_epi32(1);

    for (uint32_t i = 0; i < len; ++i) {
        counter = _mm512_mask_add_epi32(counter, data[i], counter, ones);
    }

    _mm512_storeu_si512((__m512i*)flags, counter);
    return 0;
}